

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O3

bool __thiscall
dtc::fdt::checking::property_size_checker::check
          (property_size_checker *this,device_tree *param_1,node_ptr *param_2,property_ptr *p)

{
  element_type *peVar1;
  pointer ppVar2;
  value_type vVar3;
  uint32_t uVar4;
  pointer this_00;
  
  peVar1 = (p->super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (peVar1->values).
            super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (peVar1->values).
           super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0;
  while( true ) {
    if (this_00 == ppVar2) {
      return uVar4 == this->size;
    }
    vVar3 = this_00->type;
    if (vVar3 == UNKNOWN) {
      property_value::resolve_type(this_00);
      vVar3 = this_00->type;
    }
    if (vVar3 != BINARY) break;
    uVar4 = uVar4 + (*(int *)&(this_00->byte_data).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this_00->byte_data).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    this_00 = this_00 + 1;
  }
  return false;
}

Assistant:

bool
property_size_checker::check(device_tree *, const node_ptr &, property_ptr p)
{
	uint32_t psize = 0;
	for (property::value_iterator i=p->begin(),e=p->end() ; i!=e ; ++i)
	{
		if (!i->is_binary())
		{
			return false;
		}
		psize += i->byte_data.size();
	}
	return psize == size;
}